

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.h
# Opt level: O3

string * __thiscall
dlib::impl1::msg_data::data_to_string_abi_cxx11_(string *__return_storage_ptr__,msg_data *this)

{
  element_type *peVar1;
  char *pcVar2;
  
  peVar1 = (this->data).
           super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 != (element_type *)0x0) {
    pcVar2 = (peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((peVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pcVar2) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      goto LAB_002328d0;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = "";
LAB_002328d0:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string data_to_string() const
            {
                if (data && data->size() != 0)
                    return std::string(&(*data)[0], data->size());
                else
                    return "";
            }